

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O1

void __thiscall
anon_unknown.dwarf_a40a3a::TransformSelectorRegex::~TransformSelectorRegex
          (TransformSelectorRegex *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  pointer pcVar3;
  
  (this->super_TransformSelector).super_TransformSelector._vptr_TransformSelector =
       (_func_int **)&PTR__TransformSelectorRegex_00b34d58;
  pcVar2 = (this->Regex).program;
  if (pcVar2 != (char *)0x0) {
    operator_delete__(pcVar2);
  }
  (this->super_TransformSelector).super_TransformSelector._vptr_TransformSelector =
       (_func_int **)&PTR__TransformSelector_00b34c00;
  pcVar3 = (this->super_TransformSelector).Tag._M_dataplus._M_p;
  paVar1 = &(this->super_TransformSelector).Tag.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,600);
  return;
}

Assistant:

TransformSelectorRegex(const std::string& regex)
    : TransformSelector("REGEX")
    , Regex(regex)
  {
  }